

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

QPDFObjectHandle added_page(QPDF *pdf,QPDFObjectHandle *page)

{
  QPDFObjectHandle *pQVar1;
  QPDFObjectHandle *foreign;
  QPDFObjectHandle *pQVar2;
  QPDFObjectHandle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70 [2];
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  QPDFObjectHandle *page_local;
  QPDF *pdf_local;
  QPDFObjectHandle *result;
  
  local_21 = 0;
  page_local = page;
  pdf_local = pdf;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)pdf,in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  pQVar2 = (QPDFObjectHandle *)QPDFObjectHandle::getQPDF(in_RDX,&local_48);
  pQVar1 = page_local;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  foreign = page_local;
  _Var3._M_pi = extraout_RDX;
  if (pQVar2 != pQVar1) {
    QPDFObjectHandle::QPDFObjectHandle(&local_80,in_RDX);
    QPDF::copyForeignObject((QPDF *)local_70,foreign);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)pdf,local_70);
    QPDFObjectHandle::~QPDFObjectHandle(local_70);
    QPDFObjectHandle::~QPDFObjectHandle(&local_80);
    _Var3._M_pi = extraout_RDX_00;
  }
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static QPDFObjectHandle
added_page(QPDF& pdf, QPDFObjectHandle page)
{
    QPDFObjectHandle result = page;
    if (&page.getQPDF() != &pdf) {
        // Calling copyForeignObject on an object we already copied will give us the already
        // existing copy.
        result = pdf.copyForeignObject(page);
    }
    return result;
}